

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::BeginFile
          (GoGenerator *this,string *name_space_name,bool needs_imports,bool is_enum,
          string *code_ptr)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppDVar4;
  string local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  _Self local_f0;
  _Self local_e8;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  bool is_enum_local;
  string *psStack_18;
  bool needs_imports_local;
  string *name_space_name_local;
  GoGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local._6_1_ = is_enum;
  code_ptr_local._7_1_ = needs_imports;
  psStack_18 = name_space_name;
  name_space_name_local = (string *)this;
  std::operator+(&local_50,code_ptr,
                 "// Code generated by the FlatBuffers compiler. DO NOT EDIT.\n\n");
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_90,"package ",psStack_18);
  std::operator+(&local_70,&local_90,"\n\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if ((code_ptr_local._7_1_ & 1) == 0) {
    if ((code_ptr_local._6_1_ & 1) != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"import \"strconv\"\n\n");
    }
    if ((this->needs_math_import_ & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"import \"math\"\n\n");
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)local_30,"import (\n");
    if ((this->needs_bytes_import_ & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"\t\"bytes\"\n");
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                     "\tflatbuffers \"",&(((this->super_BaseGenerator).parser_)->opts).go_import);
      std::operator+(&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,"\"\n"
                    );
      std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&it);
    }
    else {
      std::__cxx11::string::operator+=
                ((string *)local_30,"\tflatbuffers \"github.com/google/flatbuffers/go\"\n");
    }
    if ((this->needs_math_import_ & 1U) != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"\t\"math\"\n");
    }
    if ((code_ptr_local._6_1_ & 1) != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"\t\"strconv\"\n");
    }
    sVar3 = std::
            set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
            ::size(&this->tracked_imported_namespaces_);
    if (sVar3 != 0) {
      std::__cxx11::string::operator+=((string *)local_30,"\n");
      local_e8._M_node =
           (_Base_ptr)
           std::
           set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
           ::begin(&this->tracked_imported_namespaces_);
      while( true ) {
        local_f0._M_node =
             (_Base_ptr)
             std::
             set<const_flatbuffers::Definition_*,_flatbuffers::go::GoGenerator::NamespacePtrLess,_std::allocator<const_flatbuffers::Definition_*>_>
             ::end(&this->tracked_imported_namespaces_);
        bVar1 = std::operator!=(&local_e8,&local_f0);
        if (!bVar1) break;
        ppDVar4 = std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator*
                            (&local_e8);
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&(*ppDVar4)->defined_namespace->components);
        if (bVar1) {
          ppDVar4 = std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator*
                              (&local_e8);
          std::operator+(&local_170,"\t",&(*ppDVar4)->name);
          std::operator+(&local_150,&local_170," \"");
          ppDVar4 = std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator*
                              (&local_e8);
          std::operator+(&local_130,&local_150,&(*ppDVar4)->name);
          std::operator+(&local_110,&local_130,"\"\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
        }
        else {
          ppDVar4 = std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator*
                              (&local_e8);
          NamespaceImportName_abi_cxx11_(&local_210,this,(*ppDVar4)->defined_namespace);
          std::operator+(&local_1f0,"\t",&local_210);
          std::operator+(&local_1d0,&local_1f0," \"");
          ppDVar4 = std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator*
                              (&local_e8);
          NamespaceImportPath_abi_cxx11_(&local_230,this,(*ppDVar4)->defined_namespace);
          std::operator+(&local_1b0,&local_1d0,&local_230);
          std::operator+(&local_190,&local_1b0,"\"\n");
          std::__cxx11::string::operator+=((string *)local_30,(string *)&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&local_210);
        }
        std::_Rb_tree_const_iterator<const_flatbuffers::Definition_*>::operator++(&local_e8);
      }
    }
    std::__cxx11::string::operator+=((string *)local_30,")\n\n");
  }
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 const bool is_enum, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code = code +
           "// Code generated by the FlatBuffers compiler. DO NOT EDIT.\n\n";
    code += "package " + name_space_name + "\n\n";
    if (needs_imports) {
      code += "import (\n";
      // standard imports, in alphabetical order for go fmt
      if (needs_bytes_import_) code += "\t\"bytes\"\n";
      if (!parser_.opts.go_import.empty()) {
        code += "\tflatbuffers \"" + parser_.opts.go_import + "\"\n";
      } else {
        code += "\tflatbuffers \"github.com/google/flatbuffers/go\"\n";
      }
      // math is needed to support non-finite scalar default values.
      if (needs_math_import_) { code += "\t\"math\"\n"; }
      if (is_enum) { code += "\t\"strconv\"\n"; }

      if (tracked_imported_namespaces_.size() > 0) {
        code += "\n";
        for (auto it = tracked_imported_namespaces_.begin();
             it != tracked_imported_namespaces_.end(); ++it) {
          if ((*it)->defined_namespace->components.empty()) {
            code += "\t" + (*it)->name + " \"" + (*it)->name + "\"\n";
          } else {
            code += "\t" + NamespaceImportName((*it)->defined_namespace) +
                    " \"" + NamespaceImportPath((*it)->defined_namespace) +
                    "\"\n";
          }
        }
      }
      code += ")\n\n";
    } else {
      if (is_enum) { code += "import \"strconv\"\n\n"; }
      if (needs_math_import_) {
        // math is needed to support non-finite scalar default values.
        code += "import \"math\"\n\n";
      }
    }
  }